

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uchar *in,LodePNGColorMode *mode)

{
  uchar uVar1;
  uchar uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  uchar uVar7;
  uchar uVar8;
  ulong uVar9;
  long lVar10;
  uchar *puVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  
  switch(mode->colortype) {
  case LCT_GREY:
    uVar3 = mode->bitdepth;
    uVar4 = (ulong)uVar3;
    if (uVar4 == 8) {
      if (numpixels != 0) {
        sVar5 = 0;
        do {
          uVar7 = in[sVar5];
          buffer[2] = uVar7;
          buffer[1] = uVar7;
          *buffer = uVar7;
          buffer[3] = 0xff;
          sVar5 = sVar5 + 1;
          buffer = buffer + 4;
        } while (numpixels != sVar5);
      }
      if (numpixels != 0 && mode->key_defined != 0) {
        lVar10 = -numpixels;
        do {
          if (mode->key_r == (uint)buffer[lVar10 * 4]) {
            buffer[lVar10 * 4 + 3] = '\0';
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
      }
    }
    else if (uVar3 == 0x10) {
      if (numpixels != 0) {
        uVar3 = mode->key_defined;
        sVar5 = 0;
        do {
          uVar7 = in[sVar5 * 2];
          buffer[sVar5 * 4 + 2] = uVar7;
          buffer[sVar5 * 4 + 1] = uVar7;
          buffer[sVar5 * 4] = uVar7;
          if (uVar3 == 0) {
            uVar7 = 0xff;
          }
          else {
            uVar7 = -((uint)CONCAT11(uVar7,in[sVar5 * 2 + 1]) != mode->key_r);
          }
          buffer[sVar5 * 4 + 3] = uVar7;
          sVar5 = sVar5 + 1;
        } while (numpixels != sVar5);
      }
    }
    else if (numpixels != 0) {
      uVar12 = mode->key_defined;
      sVar5 = 0;
      uVar9 = 0;
      do {
        uVar15 = 0;
        uVar6 = uVar4;
        uVar14 = uVar9;
        if (uVar3 != 0) {
          do {
            uVar15 = (uint)((in[uVar14 >> 3] >> (~(byte)uVar14 & 7) & 1) != 0) + uVar15 * 2;
            uVar6 = uVar6 - 1;
            uVar14 = uVar14 + 1;
          } while (uVar6 != 0);
          uVar9 = uVar9 + uVar4;
        }
        uVar7 = (uchar)((uVar15 * 0xff) / (uint)~(-1 << ((byte)uVar3 & 0x1f)));
        buffer[2] = uVar7;
        buffer[1] = uVar7;
        *buffer = uVar7;
        if (uVar12 == 0) {
          uVar7 = 0xff;
        }
        else {
          uVar7 = -(uVar15 != mode->key_r);
        }
        buffer[3] = uVar7;
        sVar5 = sVar5 + 1;
        buffer = buffer + 4;
      } while (sVar5 != numpixels);
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      sVar5 = numpixels;
      if (numpixels != 0) {
        do {
          buffer[2] = in[2];
          *(undefined2 *)buffer = *(undefined2 *)in;
          buffer[3] = 0xff;
          buffer = buffer + 4;
          in = in + 3;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      if (numpixels != 0 && mode->key_defined != 0) {
        lVar10 = -numpixels;
        do {
          if (((mode->key_r == (uint)buffer[lVar10 * 4]) &&
              (mode->key_g == (uint)buffer[lVar10 * 4 + 1])) &&
             (mode->key_b == (uint)buffer[lVar10 * 4 + 2])) {
            buffer[lVar10 * 4 + 3] = '\0';
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
      }
    }
    else if (numpixels != 0) {
      uVar3 = mode->key_defined;
      puVar11 = in + 5;
      sVar5 = 0;
      do {
        uVar7 = puVar11[-5];
        buffer[sVar5 * 4] = uVar7;
        uVar1 = puVar11[-3];
        buffer[sVar5 * 4 + 1] = uVar1;
        uVar2 = puVar11[-1];
        buffer[sVar5 * 4 + 2] = uVar2;
        uVar8 = 0xff;
        if (((uVar3 != 0) && ((uint)CONCAT11(uVar7,puVar11[-4]) == mode->key_r)) &&
           ((uint)CONCAT11(uVar1,puVar11[-2]) == mode->key_g)) {
          uVar8 = -((uint)CONCAT11(uVar2,*puVar11) != mode->key_b);
        }
        buffer[sVar5 * 4 + 3] = uVar8;
        sVar5 = sVar5 + 1;
        puVar11 = puVar11 + 6;
      } while (numpixels != sVar5);
    }
    break;
  case LCT_PALETTE:
    uVar3 = mode->bitdepth;
    uVar4 = (ulong)uVar3;
    if (uVar4 == 8) {
      if (numpixels != 0) {
        puVar11 = mode->palette;
        sVar5 = 0;
        do {
          *(undefined4 *)(buffer + sVar5 * 4) = *(undefined4 *)(puVar11 + (ulong)in[sVar5] * 4);
          sVar5 = sVar5 + 1;
        } while (numpixels != sVar5);
      }
    }
    else if (numpixels != 0) {
      puVar11 = mode->palette;
      sVar5 = 0;
      uVar9 = 0;
      do {
        uVar13 = 0;
        uVar6 = uVar9;
        uVar14 = uVar4;
        if (uVar3 != 0) {
          do {
            uVar12 = (uint)((in[uVar6 >> 3] >> (~(byte)uVar6 & 7) & 1) != 0) + (int)uVar13 * 2;
            uVar13 = (ulong)uVar12;
            uVar14 = uVar14 - 1;
            uVar6 = uVar6 + 1;
          } while (uVar14 != 0);
          uVar9 = uVar9 + uVar4;
          uVar13 = (ulong)(uVar12 * 4);
        }
        *(undefined4 *)buffer = *(undefined4 *)(puVar11 + uVar13);
        sVar5 = sVar5 + 1;
        buffer = buffer + 4;
      } while (sVar5 != numpixels);
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        sVar5 = 0;
        do {
          uVar7 = in[sVar5 * 2];
          buffer[sVar5 * 4 + 2] = uVar7;
          buffer[sVar5 * 4 + 1] = uVar7;
          buffer[sVar5 * 4] = uVar7;
          buffer[sVar5 * 4 + 3] = in[sVar5 * 2 + 1];
          sVar5 = sVar5 + 1;
        } while (numpixels != sVar5);
      }
    }
    else if (numpixels != 0) {
      sVar5 = 0;
      do {
        uVar7 = in[sVar5 * 4];
        buffer[sVar5 * 4 + 2] = uVar7;
        buffer[sVar5 * 4 + 1] = uVar7;
        buffer[sVar5 * 4] = uVar7;
        buffer[sVar5 * 4 + 3] = in[sVar5 * 4 + 2];
        sVar5 = sVar5 + 1;
      } while (numpixels != sVar5);
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      if (numpixels << 2 != 0) {
        memcpy(buffer,in,numpixels << 2);
        return;
      }
    }
    else if (numpixels != 0) {
      sVar5 = 0;
      do {
        buffer[sVar5 * 4] = in[sVar5 * 8];
        buffer[sVar5 * 4 + 1] = in[sVar5 * 8 + 2];
        buffer[sVar5 * 4 + 2] = in[sVar5 * 8 + 4];
        buffer[sVar5 * 4 + 3] = in[sVar5 * 8 + 6];
        sVar5 = sVar5 + 1;
      } while (numpixels != sVar5);
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* LODEPNG_RESTRICT buffer, size_t numpixels,
                                const unsigned char* LODEPNG_RESTRICT in,
                                const LodePNGColorMode* mode) {
  unsigned num_channels = 4;
  size_t i;
  if(mode->colortype == LCT_GREY) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i];
        buffer[3] = 255;
      }
      if(mode->key_defined) {
        buffer -= numpixels * num_channels;
        for(i = 0; i != numpixels; ++i, buffer += num_channels) {
          if(buffer[0] == mode->key_r) buffer[3] = 0;
        }
      }
    } else if(mode->bitdepth == 16) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
        buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
      }
    } else {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
        buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
      }
    }
  } else if(mode->colortype == LCT_RGB) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        lodepng_memcpy(buffer, &in[i * 3], 3);
        buffer[3] = 255;
      }
      if(mode->key_defined) {
        buffer -= numpixels * num_channels;
        for(i = 0; i != numpixels; ++i, buffer += num_channels) {
          if(buffer[0] == mode->key_r && buffer[1]== mode->key_g && buffer[2] == mode->key_b) buffer[3] = 0;
        }
      }
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
        buffer[3] = mode->key_defined
           && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
           && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
           && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
      }
    }
  } else if(mode->colortype == LCT_PALETTE) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = in[i];
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 4);
      }
    } else {
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = readBitsFromReversedStream(&j, in, mode->bitdepth);
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 4);
      }
    }
  } else if(mode->colortype == LCT_GREY_ALPHA) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
        buffer[3] = in[i * 2 + 1];
      }
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
        buffer[3] = in[i * 4 + 2];
      }
    }
  } else if(mode->colortype == LCT_RGBA) {
    if(mode->bitdepth == 8) {
      lodepng_memcpy(buffer, in, numpixels * 4);
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
        buffer[3] = in[i * 8 + 6];
      }
    }
  }
}